

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockUnsizedStructArrayCase::init
          (BlockUnsizedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 *this_00;
  int size;
  int extraout_EAX;
  StructType *pSVar1;
  BufferBlock *pBVar2;
  int local_240;
  int local_1c4;
  int lastArrayLen;
  int ndx;
  Random rnd;
  VarType local_198;
  BufferVar local_180;
  VarType local_140;
  BufferVar local_128;
  VarType local_e8;
  BufferVar local_d0;
  BufferBlock *local_90;
  BufferBlock *block;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockUnsizedStructArrayCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_18 = pSVar1;
  glu::VarType::VarType(&local_30,TYPE_UINT_VEC2,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_30);
  glu::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  glu::VarType::VarType(&local_70,TYPE_FLOAT_MAT2X4,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_58,&local_70,4);
  glu::StructType::addMember(pSVar1,"b",&local_58);
  glu::VarType::~VarType(&local_58);
  glu::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  glu::VarType::VarType((VarType *)&block,TYPE_FLOAT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&block);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_90 = pBVar2;
  glu::VarType::VarType(&local_e8,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_d0,"u",&local_e8,0);
  bb::BufferBlock::addMember(pBVar2,&local_d0);
  bb::BufferVar::~BufferVar(&local_d0);
  glu::VarType::~VarType(&local_e8);
  pBVar2 = local_90;
  glu::VarType::VarType(&local_140,TYPE_UINT,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_128,"v",&local_140,0x1000);
  bb::BufferBlock::addMember(pBVar2,&local_128);
  bb::BufferVar::~BufferVar(&local_128);
  glu::VarType::~VarType(&local_140);
  pBVar2 = local_90;
  this_00 = &rnd.m_rnd.z;
  glu::VarType::VarType((VarType *)this_00,local_18);
  glu::VarType::VarType(&local_198,(VarType *)this_00,-1);
  bb::BufferVar::BufferVar(&local_180,"s",&local_198,0x1800);
  bb::BufferBlock::addMember(pBVar2,&local_180);
  bb::BufferVar::~BufferVar(&local_180);
  glu::VarType::~VarType(&local_198);
  glu::VarType::~VarType((VarType *)&rnd.m_rnd.z);
  bb::BufferBlock::setFlags(local_90,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    bb::BufferBlock::setInstanceName(local_90,"block");
    bb::BufferBlock::setArraySize(local_90,this->m_numInstances);
  }
  de::Random::Random((Random *)&lastArrayLen,0xf6);
  local_1c4 = 0;
  while( true ) {
    if (this->m_numInstances == 0) {
      local_240 = 1;
    }
    else {
      local_240 = this->m_numInstances;
    }
    if (local_240 <= local_1c4) break;
    size = de::Random::getInt((Random *)&lastArrayLen,1,5);
    bb::BufferBlock::setLastUnsizedArraySize(local_90,local_1c4,size);
    local_1c4 = local_1c4 + 1;
  }
  de::Random::~Random((Random *)&lastArrayLen);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_UINT_VEC2, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT2X4, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC3, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("v", VarType(glu::TYPE_UINT, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.addMember(BufferVar("s", VarType(VarType(&typeS), VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		{
			de::Random rnd(246);
			for (int ndx = 0; ndx < (m_numInstances ? m_numInstances : 1); ndx++)
			{
				const int lastArrayLen = rnd.getInt(1, 5);
				block.setLastUnsizedArraySize(ndx, lastArrayLen);
			}
		}
	}